

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_FontFaceQuartet * __thiscall
ON_FontList::QuartetFromQuartetName
          (ON_FontFaceQuartet *__return_storage_ptr__,ON_FontList *this,wchar_t *quartet_name)

{
  ON_Font *pOVar1;
  ON_Font *pOVar2;
  ON_Font *pOVar3;
  ON_FontFaceQuartet *pOVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ON_ClassArray<ON_FontFaceQuartet> *this_00;
  wchar_t *pwVar8;
  wchar_t *string2;
  ON_Font **ppOVar9;
  long lVar10;
  ON_wString *src;
  uint uVar11;
  ulong uVar12;
  ON_FontFaceQuartet *src_00;
  ON_wString locName;
  ON_FontFaceQuartet qname;
  ON_wString local_a0;
  int local_94;
  ON_wString local_90;
  ON_FontFaceQuartet *local_88;
  ON_FontFaceQuartet local_80;
  ON_FontFaceQuartet local_58;
  
  ON_FontFaceQuartet::ON_FontFaceQuartet
            (&local_58,quartet_name,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0);
  ON_wString::ON_wString(&local_80.m_quartet_name,&local_58.m_quartet_name);
  bVar5 = ON_wString::IsEmpty(&local_80.m_quartet_name);
  ON_wString::~ON_wString(&local_80.m_quartet_name);
  if (!bVar5) {
    this_00 = QuartetList(this);
    iVar7 = this_00->m_count;
    uVar6 = ON_ClassArray<ON_FontFaceQuartet>::BinarySearch
                      (this_00,&local_58,ON_FontFaceQuartet::CompareQuartetName);
    local_88 = __return_storage_ptr__;
    if (-1 < (int)uVar6 && (int)uVar6 < iVar7) {
LAB_0047abe0:
      uVar12 = (ulong)uVar6;
      lVar10 = uVar12 * 0x28;
      do {
        uVar11 = (uint)uVar12;
        uVar6 = 0;
        if ((int)uVar11 < 1) break;
        iVar7 = ON_FontFaceQuartet::CompareQuartetName
                          (&local_58,
                           (ON_FontFaceQuartet *)
                           ((long)&this_00->m_a[-1].m_quartet_name.m_s + lVar10));
        uVar12 = uVar12 - 1;
        uVar6 = uVar11;
        lVar10 = lVar10 + -0x28;
      } while (iVar7 == 0);
      pOVar4 = local_88;
      src_00 = this_00->m_a + (uVar6 & 0x7fffffff);
      ON_wString::ON_wString(&local_88->m_quartet_name,&src_00->m_quartet_name);
      pOVar1 = src_00->m_regular;
      pOVar2 = src_00->m_bold;
      pOVar3 = src_00->m_bold_italic;
      pOVar4->m_italic = src_00->m_italic;
      pOVar4->m_bold_italic = pOVar3;
      pOVar4->m_regular = pOVar1;
      pOVar4->m_bold = pOVar2;
      ON_wString::~ON_wString(&local_58.m_quartet_name);
      return pOVar4;
    }
    ON_wString::ON_wString(&local_90,quartet_name);
    ON_ManagedFonts::InstalledFonts();
    local_94 = iVar7;
    if (0 < ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_count) {
      lVar10 = 0;
      ppOVar9 = ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_a;
      iVar7 = ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_count;
      do {
        pOVar1 = ppOVar9[lVar10];
        if (pOVar1 != (ON_Font *)0x0) {
          ON_wString::ON_wString(&local_80.m_quartet_name,&pOVar1->m_en_windows_logfont_name);
          pwVar8 = ON_wString::operator_cast_to_wchar_t_(&local_90);
          string2 = ON_wString::operator_cast_to_wchar_t_(&local_80.m_quartet_name);
          iVar7 = ON_wString::CompareOrdinal(pwVar8,string2,true);
          if (iVar7 == 0) {
            bVar5 = ON_wString::IsNotEmpty(&pOVar1->m_loc_windows_logfont_name);
            src = &pOVar1->m_en_windows_logfont_name;
            if (bVar5) {
              src = &pOVar1->m_loc_windows_logfont_name;
            }
            ON_wString::ON_wString(&local_a0,src);
            ON_wString::~ON_wString(&local_80.m_quartet_name);
            goto LAB_0047ab2f;
          }
          ON_wString::~ON_wString(&local_80.m_quartet_name);
          ppOVar9 = ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_a;
          iVar7 = ON_ManagedFonts::List.m_installed_fonts.m_by_index.m_count;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < iVar7);
    }
    ON_wString::ON_wString(&local_a0,&ON_wString::EmptyString);
LAB_0047ab2f:
    iVar7 = local_94;
    ON_wString::~ON_wString(&local_90);
    bVar5 = ON_wString::IsEmpty(&local_a0);
    __return_storage_ptr__ = local_88;
    if (bVar5) {
      ON_wString::~ON_wString(&local_a0);
    }
    else {
      pwVar8 = ON_wString::operator_cast_to_wchar_t_(&local_a0);
      ON_FontFaceQuartet::ON_FontFaceQuartet
                (&local_80,pwVar8,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0,(ON_Font *)0x0);
      ON_wString::operator=(&local_58.m_quartet_name,&local_80.m_quartet_name);
      local_58.m_italic = local_80.m_italic;
      local_58.m_bold_italic = local_80.m_bold_italic;
      local_58.m_regular = local_80.m_regular;
      local_58.m_bold = local_80.m_bold;
      ON_wString::~ON_wString(&local_80.m_quartet_name);
      uVar6 = ON_ClassArray<ON_FontFaceQuartet>::BinarySearch
                        (this_00,&local_58,ON_FontFaceQuartet::CompareQuartetName);
      ON_wString::~ON_wString(&local_a0);
      if (-1 < (int)uVar6 && (int)uVar6 < iVar7) goto LAB_0047abe0;
    }
  }
  ON_wString::~ON_wString(&local_58.m_quartet_name);
  ON_wString::ON_wString
            (&__return_storage_ptr__->m_quartet_name,&ON_FontFaceQuartet::Empty.m_quartet_name);
  pOVar3 = ON_FontFaceQuartet::Empty.m_bold_italic;
  pOVar2 = ON_FontFaceQuartet::Empty.m_bold;
  pOVar1 = ON_FontFaceQuartet::Empty.m_regular;
  __return_storage_ptr__->m_italic = ON_FontFaceQuartet::Empty.m_italic;
  __return_storage_ptr__->m_bold_italic = pOVar3;
  __return_storage_ptr__->m_regular = pOVar1;
  __return_storage_ptr__->m_bold = pOVar2;
  return __return_storage_ptr__;
}

Assistant:

const ON_FontFaceQuartet ON_FontList::QuartetFromQuartetName(
  const wchar_t* quartet_name
) const
{
  for (;;)
  {
    ON_FontFaceQuartet qname(quartet_name, nullptr, nullptr, nullptr, nullptr);
    if (qname.QuartetName().IsEmpty())
      break;

    const ON_ClassArray<ON_FontFaceQuartet>& quartet_list = ON_FontList::QuartetList();
    const int quartet_list_count = quartet_list.Count();
    int i = quartet_list.BinarySearch(&qname, ON_FontFaceQuartet::CompareQuartetName);

    bool failedOnFirstTry = i < 0 || i >= quartet_list_count;
    if (failedOnFirstTry)
    {
      //  ... then find the localized name and try again.
      // The QuartetNames in the QuartetList above are localized but sometimes the quartet_name passed to
      // this function is in english. In many cases the localized name and the english name are the same
      // so there is no problem. It is a problem for Japanese and Chinese languages for example. RH-64285
      ON_wString locName = ON_FontList__EnNameToLocName(quartet_name);
      if (locName.IsEmpty())
      {
        break;
      }
      qname = ON_FontFaceQuartet(locName, nullptr, nullptr, nullptr, nullptr);
      i = quartet_list.BinarySearch(&qname, ON_FontFaceQuartet::CompareQuartetName);
      if (i < 0 || i >= quartet_list_count)
      {
        break;
      }
    }

    while (i > 0 && 0 == ON_FontFaceQuartet::CompareQuartetName(&qname, &quartet_list[i - 1]))
      i--;
    return quartet_list[i];
  }
  return ON_FontFaceQuartet::Empty;
}